

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsProxyWidget::focusInEvent(QGraphicsProxyWidget *this,QFocusEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  bool bVar1;
  int iVar2;
  FocusReason reason;
  QWidget *pQVar3;
  
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  if ((*(uint *)&this_00->field_0x244 >> 0xe & 1) != 0) {
    return;
  }
  *(ushort *)&this_00->field_0x244 = (ushort)*(uint *)&this_00->field_0x244 | 0x8000;
  iVar2 = QFocusEvent::reason();
  if (iVar2 == 2) {
    bVar1 = false;
LAB_005905b1:
    pQVar3 = QGraphicsProxyWidgetPrivate::findFocusChild(this_00,(QWidget *)0x0,bVar1);
    if (pQVar3 == (QWidget *)0x0) goto LAB_00590615;
  }
  else {
    if (iVar2 == 1) {
      bVar1 = true;
      goto LAB_005905b1;
    }
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this_00->widget);
    if ((!bVar1) ||
       (pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value),
       pQVar3 == (QWidget *)0x0)) goto LAB_00590615;
    pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
  }
  reason = QFocusEvent::reason();
  QWidget::setFocus(pQVar3,reason);
LAB_00590615:
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this_00->widget);
  if (((bVar1) &&
      (pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value),
      pQVar3 != (QWidget *)0x0)) &&
     (pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value),
     (pQVar3->data->widget_attributes & 0x4000) != 0)) {
    QGuiApplication::inputMethod();
    QInputMethod::reset();
  }
  this_00->field_0x245 = this_00->field_0x245 & 0x7f;
  return;
}

Assistant:

T *data() const noexcept
    {
        return d;
    }